

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O3

QString * qulltoa(QString *__return_storage_ptr__,qulonglong number,int base,QStringView zero)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  ushort uVar4;
  bool bVar5;
  char16_t cVar6;
  ulong uVar7;
  uint uVar8;
  QChar *pQVar9;
  uint uVar10;
  char16_t cVar11;
  char16_t *pcVar12;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  char16_t buff [128];
  char16_t local_2c [2];
  long local_28;
  
  pcVar12 = zero.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = (QChar *)&local_28;
  if (base != 10) {
    uVar7 = (ulong)base;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = number;
      sVar3 = SUB162(auVar2 % auVar1,0);
      cVar11 = sVar3 + L'0';
      if (9 < SUB164(auVar2 % auVar1,0)) {
        cVar11 = sVar3 + L'W';
      }
      pQVar9[-1].ucs = cVar11;
      pQVar9 = pQVar9 + -1;
      bVar5 = uVar7 <= number;
      number = number / uVar7;
    } while (bVar5);
    goto LAB_0031dd22;
  }
  if (zero.m_size == 1) {
    rhs.m_data = L"0";
    rhs.m_size = 1;
    lhs.m_data = pcVar12;
    lhs.m_size = 1;
    bVar5 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar5) {
      do {
        pQVar9[-1].ucs = (short)number + (short)(number / 10) * -10 | 0x30;
        pQVar9 = pQVar9 + -1;
        bVar5 = 9 < number;
        number = number / 10;
      } while (bVar5);
      goto LAB_0031dd22;
    }
    cVar11 = *pcVar12;
LAB_0031dc25:
    if ((cVar11 & 0xf800U) != 0xd800) {
      if (number != 0) {
        do {
          cVar6 = cVar11;
          if (number % 10 != 0) {
            uVar4 = (ushort)(number % 10);
            if (cVar11 == L'〇') {
              cVar6 = uVar4 | 0x3020;
            }
            else {
              cVar6 = uVar4 + cVar11;
            }
          }
          pQVar9[-1].ucs = cVar6;
          pQVar9 = pQVar9 + -1;
          bVar5 = 9 < number;
          number = number / 10;
        } while (bVar5);
      }
      goto LAB_0031dd22;
    }
  }
  else {
    cVar11 = *pcVar12;
    if (zero.m_size != 0) goto LAB_0031dc25;
  }
  if (number != 0) {
    uVar10 = (uint)(ushort)cVar11 * 0x400 + (uint)(ushort)pcVar12[1] + 0xfca02400;
    do {
      uVar8 = uVar10;
      if (number % 10 != 0) {
        uVar8 = (uint)(number % 10);
        if (uVar10 == 0x3007) {
          uVar8 = uVar8 | 0x3020;
        }
        else {
          uVar8 = uVar8 + uVar10;
        }
      }
      pQVar9[-1].ucs = (ushort)uVar8 & 0x3ff | 0xdc00;
      pQVar9[-2].ucs = (short)(uVar8 >> 10) + L'ퟀ';
      pQVar9 = pQVar9 + -2;
      bVar5 = 9 < number;
      number = number / 10;
    } while (bVar5);
  }
LAB_0031dd22:
  QString::QString(__return_storage_ptr__,pQVar9,(long)&local_28 - (long)pQVar9 >> 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qulltoa(qulonglong number, int base, const QStringView zero)
{
    // Length of MAX_ULLONG in base 2 is 64; and we may need a surrogate pair
    // per digit. We do not need a terminator.
    const unsigned maxlen = 128;
    static_assert(CHAR_BIT * sizeof(number) <= maxlen);
    Q_DECL_UNINITIALIZED char16_t buff[maxlen];
    char16_t *const end = buff + maxlen, *p = end;

    if (base != 10 || zero == u"0") {
        qulltoString_helper<char16_t>(number, base, p);
    } else if (zero.size() && !zero.at(0).isSurrogate()) {
        const char16_t zeroUcs2 = zero.at(0).unicode();
        while (number != 0) {
            *(--p) = unicodeForDigit(number % base, zeroUcs2);

            number /= base;
        }
    } else if (zero.size() == 2 && zero.at(0).isHighSurrogate()) {
        const char32_t zeroUcs4 = QChar::surrogateToUcs4(zero.at(0), zero.at(1));
        while (number != 0) {
            const char32_t digit = unicodeForDigit(number % base, zeroUcs4);

            *(--p) = QChar::lowSurrogate(digit);
            *(--p) = QChar::highSurrogate(digit);

            number /= base;
        }
    } else { // zero should always be either a non-surrogate or a surrogate pair:
        Q_UNREACHABLE_RETURN(QString());
    }

    return QString(reinterpret_cast<QChar *>(p), end - p);
}